

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O1

void log_vprintf(ly_ctx *ctx,LY_LOG_LEVEL level,LY_ERR err,LY_VECODE vecode,char *data_path,
                char *schema_path,uint64_t line,char *apptag,char *format,__va_list_tag *args)

{
  ly_err_item *plVar1;
  uint *puVar2;
  ly_err_item *plVar3;
  bool bVar4;
  bool bVar5;
  char *__ptr;
  byte bVar6;
  int iVar7;
  long lVar8;
  char *__ptr_00;
  ly_ctx_err_rec *plVar9;
  ly_err_item *plVar10;
  ulong uVar11;
  char *local_50;
  char *local_48;
  ulong local_40;
  LY_VECODE local_34;
  
  local_50 = (char *)0x0;
  local_34 = vecode;
  lVar8 = __tls_get_addr(&PTR_00205fa0);
  uVar11 = ly_log_opts;
  if (*(uint **)(lVar8 + 0x240) != (uint *)0x0) {
    uVar11 = (ulong)**(uint **)(lVar8 + 0x240);
  }
  bVar5 = true;
  if (ly_ll < level) goto LAB_001109be;
  local_40 = uVar11;
  if (err == LY_EMEM) {
    local_48 = (char *)(lVar8 + 0x40);
    vsnprintf(local_48,0x200,format,args);
  }
  else {
    iVar7 = vasprintf(&local_50,format,args);
    if (iVar7 == -1) {
      ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","log_vprintf");
      goto LAB_001109be;
    }
    local_48 = local_50;
    strncpy((char *)(lVar8 + 0x40),local_50,0x1ff);
  }
  __ptr = local_50;
  if (((local_50 != (char *)0x0 && (ctx != (ly_ctx *)0x0 && level < LY_LLVRB)) &
      (byte)(uVar11 >> 1) & 0x7f) == 1) {
    if (apptag == (char *)0x0) {
      __ptr_00 = (char *)0x0;
    }
    else {
      __ptr_00 = strdup(apptag);
    }
    plVar9 = ly_err_get_rec(ctx);
    if ((plVar9 == (ly_ctx_err_rec *)0x0) &&
       (plVar9 = ly_err_new_rec(ctx), plVar9 == (ly_ctx_err_rec *)0x0)) {
LAB_00110947:
      bVar4 = false;
      ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","log_store");
      free(__ptr);
      free(data_path);
      free(schema_path);
      free(__ptr_00);
      bVar6 = (byte)local_40;
    }
    else {
      plVar1 = plVar9->err;
      if (plVar1 == (ly_err_item *)0x0) {
        plVar10 = (ly_err_item *)calloc(1,0x48);
        if (plVar10 == (ly_err_item *)0x0) goto LAB_00110947;
        plVar10->prev = plVar10;
        plVar10->next = (ly_err_item *)0x0;
        plVar9->err = plVar10;
      }
      else {
        puVar2 = *(uint **)(lVar8 + 0x240);
        if (puVar2 == (uint *)0x0) {
LAB_00110882:
          if ((~(uint)ly_log_opts & 6) != 0) {
LAB_001108dd:
            plVar3 = plVar1->prev;
            plVar10 = (ly_err_item *)calloc(1,0x48);
            plVar1->prev = plVar10;
            if (plVar10 != (ly_err_item *)0x0) {
              plVar10->prev = plVar3;
              plVar10->next = (ly_err_item *)0x0;
              plVar3->next = plVar10;
              goto LAB_0011090c;
            }
            goto LAB_00110947;
          }
        }
        else if ((~*puVar2 & 6) != 0) {
          if (puVar2 == (uint *)0x0) goto LAB_00110882;
          goto LAB_001108dd;
        }
        free(plVar1->msg);
        free(plVar1->data_path);
        free(plVar1->schema_path);
        free(plVar1->apptag);
        plVar10 = plVar1;
      }
LAB_0011090c:
      plVar10->level = level;
      plVar10->err = err;
      plVar10->vecode = local_34;
      plVar10->msg = __ptr;
      plVar10->data_path = data_path;
      plVar10->schema_path = schema_path;
      plVar10->line = line;
      plVar10->apptag = __ptr_00;
      bVar4 = true;
      bVar6 = (byte)local_40;
    }
    bVar5 = false;
    if ((!bVar4) || (bVar4 = false, (bVar6 & 1) == 0)) goto LAB_001109be;
  }
  else {
    bVar5 = true;
    bVar4 = true;
    if ((local_40 & 1) == 0) goto LAB_001109be;
  }
  bVar5 = bVar4;
  if (log_clb == (ly_log_clb)0x0) {
    fprintf(_stderr,"libyang[%d]: ",(ulong)level);
    fputs(local_48,_stderr);
    log_stderr_path_line(data_path,schema_path,line);
  }
  else {
    (*log_clb)(level,local_48,data_path,schema_path,line);
  }
LAB_001109be:
  if (bVar5) {
    free(data_path);
    free(schema_path);
    free(local_50);
  }
  return;
}

Assistant:

static void
log_vprintf(const struct ly_ctx *ctx, LY_LOG_LEVEL level, LY_ERR err, LY_VECODE vecode, char *data_path,
        char *schema_path, uint64_t line, const char *apptag, const char *format, va_list args)
{
    char *dyn_msg = NULL;
    const char *msg;
    ly_bool free_strs = 1, lolog, lostore;

    /* learn effective logger options */
    if (temp_ly_log_opts) {
        lolog = *temp_ly_log_opts & LY_LOLOG;
        lostore = *temp_ly_log_opts & LY_LOSTORE;
    } else {
        lolog = ATOMIC_LOAD_RELAXED(ly_log_opts) & LY_LOLOG;
        lostore = ATOMIC_LOAD_RELAXED(ly_log_opts) & LY_LOSTORE;
    }

    if (level > ATOMIC_LOAD_RELAXED(ly_ll)) {
        /* do not print or store the message */
        goto cleanup;
    }

    if (err == LY_EMEM) {
        /* no not use more dynamic memory */
        vsnprintf(last_msg, LY_LAST_MSG_SIZE, format, args);
        msg = last_msg;
    } else {
        /* print into a single message */
        if (vasprintf(&dyn_msg, format, args) == -1) {
            LOGMEM(ctx);
            goto cleanup;
        }
        msg = dyn_msg;

        /* store as the last message */
        strncpy(last_msg, msg, LY_LAST_MSG_SIZE - 1);
    }

    /* store the error/warning in the context (if we need to store errors internally, it does not matter what are
     * the user log options), if the message is not dynamic, it would most likely fail to store (no memory) */
    if ((level < LY_LLVRB) && ctx && lostore && dyn_msg) {
        free_strs = 0;
        if (log_store(ctx, level, err, vecode, dyn_msg, data_path, schema_path, line, apptag ? strdup(apptag) : NULL)) {
            goto cleanup;
        }
    }

    /* if we are only storing errors internally, never print the message (yet) */
    if (lolog) {
        if (log_clb) {
            log_clb(level, msg, data_path, schema_path, line);
        } else {
            fprintf(stderr, "libyang[%d]: ", level);
            fprintf(stderr, "%s", msg);
            log_stderr_path_line(data_path, schema_path, line);
        }
    }

cleanup:
    if (free_strs) {
        free(data_path);
        free(schema_path);
        free(dyn_msg);
    }
}